

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O2

WebPMuxError WebPMuxNumChunks(WebPMux *mux,WebPChunkId id,int *num_elements)

{
  WebPChunk *pWVar1;
  int iVar2;
  WebPChunk **ppWVar3;
  ulong uVar4;
  ulong uVar5;
  WebPChunkId *pWVar6;
  
  if (num_elements == (int *)0x0 || mux == (WebPMux *)0x0) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  if ((id < WEBP_CHUNK_EXIF) && ((0x68U >> (id & 0x1f) & 1) != 0)) {
    iVar2 = MuxImageCount(mux->images_,id);
  }
  else {
    ppWVar3 = MuxGetChunkListFromId(mux,id);
    uVar5 = 0;
    uVar4 = 10;
    for (pWVar6 = &kChunks[0].id; *pWVar6 != WEBP_CHUNK_NIL; pWVar6 = pWVar6 + 3) {
      if (*pWVar6 == id) {
        uVar4 = uVar5 & 0xffffffff;
        break;
      }
      uVar5 = uVar5 + 1;
    }
    iVar2 = 0;
    while (pWVar1 = *ppWVar3, pWVar1 != (WebPChunk *)0x0) {
      if ((kChunks[uVar4].tag == 0) || (pWVar1->tag_ == kChunks[uVar4].tag)) {
        iVar2 = iVar2 + 1;
      }
      ppWVar3 = &pWVar1->next_;
    }
  }
  *num_elements = iVar2;
  return WEBP_MUX_OK;
}

Assistant:

WebPMuxError WebPMuxNumChunks(const WebPMux* mux,
                              WebPChunkId id, int* num_elements) {
  if (mux == NULL || num_elements == NULL) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }

  if (IsWPI(id)) {
    *num_elements = MuxImageCount(mux->images_, id);
  } else {
    WebPChunk* const* chunk_list = MuxGetChunkListFromId(mux, id);
    const CHUNK_INDEX idx = ChunkGetIndexFromId(id);
    *num_elements = CountChunks(*chunk_list, kChunks[idx].tag);
  }

  return WEBP_MUX_OK;
}